

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O0

void __thiscall
adios2::aggregator::MPIChain::ResizeUpdateBuffer
          (MPIChain *this,size_t newSize,Buffer *buffer,string *hint)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long *in_RDX;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  long *local_18;
  ulong local_10;
  
  if (in_RDX[5] == 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe38,(string *)in_RCX);
    (**(code **)(*in_RDX + 0x20))(in_RDX,in_RSI,(string *)&stack0xfffffffffffffe38);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
    local_18[6] = local_10;
  }
  else if ((ulong)in_RDX[5] < in_RSI) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Toolkit",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"aggregator::mpi::MPIChain",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"ResizeUpdateBuffer",&local_a1);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe38);
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe38);
    std::operator+(in_stack_fffffffffffffe38,in_RCX);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    helper::Throw<std::invalid_argument>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void MPIChain::ResizeUpdateBuffer(const size_t newSize, format::Buffer &buffer,
                                  const std::string hint)
{
    if (buffer.m_FixedSize > 0)
    {
        if (newSize > buffer.m_FixedSize)
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "aggregator::mpi::MPIChain", "ResizeUpdateBuffer",
                "requesting new size: " + std::to_string(newSize) +
                    " bytes, for fixed size buffer " + std::to_string(buffer.m_FixedSize) +
                    " of type " + buffer.m_Type + ", allocate more memory");
        }
        return; // do nothing if fixed size is enough
    }

    buffer.Resize(newSize, hint);
    buffer.m_Position = newSize;
}